

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O3

void savemonchn(memfile *mf,monst *mtmp)

{
  obj **ppoVar1;
  monst *pmVar2;
  int value;
  
  mfmagic_set(mf,0x4e48434d);
  if (mtmp != (monst *)0x0) {
    value = 0;
    pmVar2 = mtmp;
    do {
      value = value + 1;
      pmVar2 = pmVar2->nmon;
    } while (pmVar2 != (monst *)0x0);
    mwrite32(mf,value);
    while (mtmp != (monst *)0x0) {
      pmVar2 = mtmp->nmon;
      save_mon(mf,mtmp);
      ppoVar1 = &mtmp->minvent;
      mtmp = pmVar2;
      if (*ppoVar1 != (obj *)0x0) {
        saveobjchn(mf,*ppoVar1);
      }
    }
    return;
  }
  mwrite32(mf,0);
  return;
}

Assistant:

static void savemonchn(struct memfile *mf, struct monst *mtmp)
{
	struct monst *mtmp2;
	unsigned int count = 0;
	
	mfmagic_set(mf, MONCHAIN_MAGIC);
	for (mtmp2 = mtmp; mtmp2; mtmp2 = mtmp2->nmon)
	    count++;
	mwrite32(mf, count);

	while (mtmp) {
	    mtmp2 = mtmp->nmon;
	    save_mon(mf, mtmp);
	    
	    if (mtmp->minvent)
		saveobjchn(mf, mtmp->minvent);
	    mtmp = mtmp2;
	}
}